

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindLargest(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  undefined8 *puVar2;
  IteratorWrapper *pIVar3;
  int iVar4;
  IteratorWrapper *pIVar5;
  IteratorWrapper *pIVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (long)this->n_;
  if (lVar7 < 1) {
    pIVar6 = (IteratorWrapper *)0x0;
  }
  else {
    lVar8 = lVar7 + 1;
    pIVar5 = (IteratorWrapper *)0x0;
    lVar7 = lVar7 << 5;
    do {
      pIVar3 = this->children_;
      pIVar6 = pIVar5;
      if (((&pIVar3[-1].valid_)[lVar7] == true) &&
         (pIVar1 = (IteratorWrapper *)((long)&pIVar3[-1].iter_ + lVar7), pIVar6 = pIVar1,
         pIVar5 != (IteratorWrapper *)0x0)) {
        if ((&pIVar3[-1].valid_)[lVar7] == false) {
LAB_00d213ed:
          __assert_fail("Valid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                        ,0x27,"Slice leveldb::IteratorWrapper::key() const");
        }
        puVar2 = (undefined8 *)((long)&pIVar3[-1].key_.data_ + lVar7);
        local_48 = *puVar2;
        uStack_40 = puVar2[1];
        if (pIVar5->valid_ == false) goto LAB_00d213ed;
        local_58 = *(undefined4 *)&(pIVar5->key_).data_;
        uStack_54 = *(undefined4 *)((long)&(pIVar5->key_).data_ + 4);
        uStack_50 = (undefined4)(pIVar5->key_).size_;
        uStack_4c = *(undefined4 *)((long)&(pIVar5->key_).size_ + 4);
        iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_48,&local_58);
        pIVar6 = pIVar5;
        if (0 < iVar4) {
          pIVar6 = pIVar1;
        }
      }
      lVar8 = lVar8 + -1;
      pIVar5 = pIVar6;
      lVar7 = lVar7 + -0x20;
    } while (1 < lVar8);
  }
  this->current_ = pIVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MergingIterator::FindLargest() {
  IteratorWrapper* largest = nullptr;
  for (int i = n_ - 1; i >= 0; i--) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (largest == nullptr) {
        largest = child;
      } else if (comparator_->Compare(child->key(), largest->key()) > 0) {
        largest = child;
      }
    }
  }
  current_ = largest;
}